

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5VocabInstanceNewTerm(Fts5VocabCursor *pCsr)

{
  u32 uVar1;
  Fts5IndexIter *pFVar2;
  long lVar3;
  u32 uVar4;
  int iVar5;
  long lVar6;
  u32 nData;
  u8 *pData;
  long in_FS_OFFSET;
  int rc;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  pFVar2 = pCsr->pIter;
  if (pFVar2->bEof == '\0') {
    lVar6 = (ulong)*(ushort *)(pFVar2[4].iRowid + 4) * 0x80;
    lVar3 = *(long *)((long)pFVar2 + lVar6 + 200);
    nData = *(int *)((long)pFVar2 + lVar6 + 0xd0) - 1;
    pData = (u8 *)(lVar3 + 1);
    if (lVar3 == 0) {
      pData = (u8 *)0x0;
    }
    uVar1 = pCsr->nLeTerm;
    if (-1 < (int)uVar1) {
      uVar4 = uVar1;
      if ((int)nData < (int)uVar1) {
        uVar4 = nData;
      }
      iVar5 = memcmp(pCsr->zLeTerm,pData,(long)(int)uVar4);
      if ((iVar5 < 0) || ((int)uVar1 < (int)nData && iVar5 == 0)) {
        pCsr->bEof = 1;
      }
    }
    (pCsr->term).n = 0;
    sqlite3Fts5BufferAppendBlob(&local_2c,&pCsr->term,nData,pData);
  }
  else {
    pCsr->bEof = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5VocabInstanceNewTerm(Fts5VocabCursor *pCsr){
  int rc = SQLITE_OK;

  if( sqlite3Fts5IterEof(pCsr->pIter) ){
    pCsr->bEof = 1;
  }else{
    const char *zTerm;
    int nTerm;
    zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
    if( pCsr->nLeTerm>=0 ){
      int nCmp = MIN(nTerm, pCsr->nLeTerm);
      int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
      if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
        pCsr->bEof = 1;
      }
    }

    sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
  }
  return rc;
}